

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O2

void DBaseDecal::SpreadRight(double r,side_t *feelwall,double wallsize,F3DFloor *ffloor)

{
  double dVar1;
  long lVar2;
  side_t *feelwall_00;
  ulong uVar3;
  side_t *wall;
  double dVar4;
  double ldy;
  double ldx;
  vertex_t *v1;
  double local_80;
  double local_78;
  side_t *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  vertex_t *local_38;
  
  local_80 = r;
  local_78 = wallsize;
  local_70 = feelwall;
  do {
    TArray<side_t_*,_side_t_*>::Push(&SpreadStack,&local_70);
    if ((local_80 <= local_78) || ((ulong)local_70->RightSide == 0xffffffff)) {
      return;
    }
    wall = sides + local_70->RightSide;
    local_70 = wall;
    feelwall_00 = NextWall(wall);
    if ((feelwall_00 != (side_t *)0x0) && (feelwall_00->LeftSide != 0xffffffff)) {
      uVar3 = (ulong)SpreadStack.Count;
      do {
        if ((int)uVar3 < 1) {
          if (uVar3 == 0) {
            SpreadRight(local_80,feelwall_00,local_78,ffloor);
            wall = local_70;
          }
          break;
        }
        lVar2 = uVar3 - 1;
        uVar3 = uVar3 - 1;
      } while (SpreadStack.Array[lVar2] != feelwall_00);
    }
    dVar4 = (local_78 + (DecalWidth - local_80)) - DecalLeft;
    GetWallStuff(wall,&local_38,&local_40,&local_48);
    local_58 = (local_38->p).X;
    dVar1 = (local_38->p).Y;
    local_68 = local_40;
    local_60 = local_48;
    local_50 = Length(local_40,local_48);
    local_80 = DecalRight - dVar4;
    (*(SpreadSource->super_DThinker).super_DObject._vptr_DObject[10])
              (local_58 - (local_68 * dVar4) / local_50,dVar1 - (local_60 * dVar4) / local_50,
               SpreadZ,SpreadSource,SpreadTemplate,local_70,ffloor);
    local_78 = local_50;
  } while( true );
}

Assistant:

void DBaseDecal::SpreadRight (double r, side_t *feelwall, double wallsize, F3DFloor *ffloor)
{
	vertex_t *v1;
	double x, y, ldx, ldy;

	SpreadStack.Push (feelwall);

	while (r > wallsize && feelwall->RightSide != NO_SIDE)
	{
		feelwall = &sides[feelwall->RightSide];

		side_t *nextwall = NextWall (feelwall);
		if (nextwall != NULL && nextwall->LeftSide != NO_SIDE)
		{
			int i;

			for (i = SpreadStack.Size(); i-- > 0; )
			{
				if (SpreadStack[i] == nextwall)
					break;
			}
			if (i == -1)
			{
				SpreadRight (r, nextwall, wallsize, ffloor);
			}
		}

		r = DecalWidth - r + wallsize - DecalLeft;
		GetWallStuff (feelwall, v1, ldx, ldy);
		x = v1->fX();
		y = v1->fY();
		wallsize = Length (ldx, ldy);
		x -= r*ldx / wallsize;
		y -= r*ldy / wallsize;
		r = DecalRight - r;
		SpreadSource->CloneSelf (SpreadTemplate, x, y, SpreadZ, feelwall, ffloor);
		SpreadStack.Push (feelwall);
	}
}